

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.cpp
# Opt level: O3

void __thiscall imrt::Plan::write_open_beamlets(Plan *this)

{
  Station *this_00;
  _List_node_base *p_Var1;
  int iVar2;
  ostream *poVar3;
  _List_node_base *p_Var4;
  long *plVar5;
  char cVar6;
  int iVar7;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *plVar8;
  bool bVar9;
  long lVar10;
  _List_node_base *p_Var11;
  set<int,_std::less<int>,_std::allocator<int>_> open_beamlets;
  ofstream myfile;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_278;
  _List_node_base local_248;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,0x120b49);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"Angles\t",7);
  plVar8 = &this->stations;
  p_Var4 = (_List_node_base *)plVar8;
  while (p_Var4 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                   &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)plVar8) {
    poVar3 = (ostream *)
             std::ostream::operator<<((ostream *)&local_230,*(int *)((long)p_Var4[1]._M_next + 8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
  }
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  cVar6 = (char)(ostream *)&local_230;
  std::ostream::put(cVar6);
  std::ostream::flush();
  p_Var4 = (plVar8->super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>)._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)plVar8) {
    iVar7 = 0;
    do {
      this_00 = (Station *)p_Var4[1]._M_next;
      local_278._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_278._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_278._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_278._M_impl.super__Rb_tree_header._M_header;
      local_278._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_278._M_impl.super__Rb_tree_header._M_header._M_right =
           local_278._M_impl.super__Rb_tree_header._M_header._M_left;
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar6);
      std::ostream::put(cVar6);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Station Angle\t",0xe);
      plVar5 = (long *)std::ostream::operator<<((ostream *)poVar3,this_00->angle);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      if (0 < this_00->max_apertures) {
        lVar10 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"Aperture\t",9);
          plVar5 = (long *)std::ostream::operator<<((ostream *)&local_230,(int)lVar10);
          std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
          std::ostream::put((char)plVar5);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"Intensity\t",10)
          ;
          poVar3 = std::ostream::_M_insert<double>
                             ((this_00->intensity).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar10]);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_230,"OpenBeamlets\t",0xd);
          Station::open_beamlets_abi_cxx11_
                    ((list<int,_std::allocator<int>_> *)&local_248,this_00,(int)lVar10);
          bVar9 = true;
          p_Var11 = &local_248;
          while (p_Var11 = (((_List_base<int,_std::allocator<int>_> *)&p_Var11->_M_next)->_M_impl).
                           _M_node.super__List_node_base._M_next, p_Var1 = local_248._M_next,
                p_Var11 != &local_248) {
            iVar2 = *(int *)&p_Var11[1]._M_next;
            if (!bVar9) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
            }
            bVar9 = false;
            std::ostream::operator<<((ostream *)&local_230,iVar2 + iVar7);
          }
          while (p_Var1 != &local_248) {
            p_Var11 = p_Var1->_M_next;
            operator_delete(p_Var1);
            p_Var1 = p_Var11;
          }
          std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar6);
          std::ostream::put(cVar6);
          std::ostream::flush();
          lVar10 = lVar10 + 1;
        } while (lVar10 < this_00->max_apertures);
      }
      iVar2 = Collimator::getNangleBeamlets(this_00->collimator,this_00->angle);
      iVar7 = iVar7 + iVar2;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_278);
      p_Var4 = p_Var4->_M_next;
    } while (p_Var4 != (_List_node_base *)plVar8);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Plan::write_open_beamlets(){
    ofstream myfile;
    myfile.open ("openbeamlets.txt");

    myfile << "Angles\t";
    for(auto s:stations)
      myfile << s->getAngle() << "\t";
    myfile << endl;
    int k=0;
    for(auto s:stations){
      set<int> open_beamlets;
      myfile << endl << "Station Angle\t" << s->getAngle() << endl;
      for(int i=0; i<s->getNbApertures(); i++){
        myfile << "Aperture\t" << i << endl;
        myfile << "Intensity\t" << s->intensity[i] << endl;

        myfile << "OpenBeamlets\t" ;
        bool first=true;
        for(auto beam:s->open_beamlets(i)){
          if(!first) myfile << "\t";
          first=false;
          myfile << k+beam;
        }
        myfile << endl;
      }
      k+=s->getNbBeamlets();
    }
    myfile.close();

  }